

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fight.c
# Opt level: O0

void do_enlist(CHAR_DATA *ch,char *argument)

{
  bool bVar1;
  int iVar2;
  CClass *this;
  CHAR_DATA *pCVar3;
  char *pcVar4;
  CHAR_DATA *in_RDI;
  CHAR_DATA *check;
  int chance;
  AFFECT_DATA af;
  char buf [4608];
  int level;
  char arg [4608];
  CHAR_DATA *victim;
  CHAR_DATA *in_stack_ffffffffffffdb48;
  char *__s;
  CHAR_DATA *ch_00;
  undefined4 in_stack_ffffffffffffdb58;
  int in_stack_ffffffffffffdb5c;
  char_data *in_stack_ffffffffffffdb60;
  CHAR_DATA *ch_01;
  int in_stack_ffffffffffffdb84;
  undefined2 in_stack_ffffffffffffdb88;
  undefined2 in_stack_ffffffffffffdb8a;
  undefined2 in_stack_ffffffffffffdb8c;
  undefined2 in_stack_ffffffffffffdb8e;
  int in_stack_ffffffffffffdb90;
  char local_2428 [116];
  int in_stack_ffffffffffffdc4c;
  CHAR_DATA *in_stack_ffffffffffffdc50;
  int in_stack_ffffffffffffdd74;
  CHAR_DATA *in_stack_ffffffffffffdd78;
  CHAR_DATA *in_stack_ffffffffffffdd80;
  char *in_stack_ffffffffffffed50;
  CHAR_DATA *in_stack_ffffffffffffed58;
  int local_121c;
  char local_1218;
  char *in_stack_ffffffffffffeed0;
  CHAR_DATA *in_stack_ffffffffffffeed8;
  
  iVar2 = get_skill(in_stack_ffffffffffffdc50,in_stack_ffffffffffffdc4c);
  if (10 < iVar2) {
    in_stack_ffffffffffffdb5c = (int)in_RDI->level;
    ch_00 = (CHAR_DATA *)(skill_table + gsn_enlist);
    this = char_data::Class(in_stack_ffffffffffffdb60);
    iVar2 = CClass::GetIndex(this);
    if (*(short *)((long)&ch_00->next_in_room + (long)iVar2 * 2) <= in_stack_ffffffffffffdb5c) {
      one_argument((char *)ch_00,(char *)in_stack_ffffffffffffdb48);
      bVar1 = is_affected(in_RDI,(int)gsn_enlist);
      if (bVar1) {
        send_to_char((char *)in_stack_ffffffffffffdb60,
                     (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffdb5c,in_stack_ffffffffffffdb58));
        return;
      }
      if (local_1218 == '\0') {
        send_to_char((char *)in_stack_ffffffffffffdb60,
                     (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffdb5c,in_stack_ffffffffffffdb58));
        return;
      }
      pCVar3 = get_char_room(in_stack_ffffffffffffed58,in_stack_ffffffffffffed50);
      if (pCVar3 == (CHAR_DATA *)0x0) {
        send_to_char((char *)in_stack_ffffffffffffdb60,
                     (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffdb5c,in_stack_ffffffffffffdb58));
        return;
      }
      if (pCVar3 != in_RDI) {
        bVar1 = is_npc(in_stack_ffffffffffffdb48);
        ch_01 = char_list;
        if (!bVar1) {
          send_to_char((char *)in_stack_ffffffffffffdb60,
                       (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffdb5c,in_stack_ffffffffffffdb58));
          return;
        }
        for (; ch_01 != (CHAR_DATA *)0x0; ch_01 = ch_01->next) {
          bVar1 = is_affected(ch_01,(int)gsn_enlist);
          if ((bVar1) && (ch_01->master == in_RDI)) {
            send_to_char((char *)ch_01,
                         (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffdb5c,in_stack_ffffffffffffdb58))
            ;
            return;
          }
        }
        local_121c = (int)in_RDI->level;
        bVar1 = is_good(in_stack_ffffffffffffdb48);
        if (((bVar1) && (bVar1 = is_evil(in_stack_ffffffffffffdb48), bVar1)) ||
           ((bVar1 = is_evil(in_stack_ffffffffffffdb48), bVar1 &&
            (bVar1 = is_good(in_stack_ffffffffffffdb48), bVar1)))) {
          local_121c = 0;
        }
        bVar1 = is_neutral(in_stack_ffffffffffffdb48);
        if ((bVar1) || (bVar1 = is_neutral(in_stack_ffffffffffffdb48), bVar1)) {
          local_121c = local_121c + -4;
        }
        bVar1 = is_affected_by((CHAR_DATA *)
                               CONCAT44(in_stack_ffffffffffffdb5c,in_stack_ffffffffffffdb58),
                               (int)((ulong)ch_00 >> 0x20));
        if (bVar1) {
          local_121c = 0;
        }
        if (local_121c < pCVar3->level + 8) {
          local_121c = 0;
        }
        bVar1 = saves_spell(in_stack_ffffffffffffdb90,
                            (CHAR_DATA *)
                            CONCAT26(in_stack_ffffffffffffdb8e,
                                     CONCAT24(in_stack_ffffffffffffdb8c,
                                              CONCAT22(in_stack_ffffffffffffdb8a,
                                                       in_stack_ffffffffffffdb88))),
                            in_stack_ffffffffffffdb84);
        if ((!bVar1) && (local_121c != 0)) {
          pCVar3->leader = in_RDI;
          pCVar3->master = in_RDI;
          init_affect((AFFECT_DATA *)0x5ecc90);
          std::pow<int,int>(0,0x5eccd8);
          affect_to_char(ch_00,(AFFECT_DATA *)in_stack_ffffffffffffdb48);
          affect_to_char(ch_00,(AFFECT_DATA *)in_stack_ffffffffffffdb48);
          act((char *)ch_01,
              (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffdb5c,in_stack_ffffffffffffdb58),ch_00,
              in_stack_ffffffffffffdb48,0);
          act((char *)ch_01,
              (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffdb5c,in_stack_ffffffffffffdb58),ch_00,
              in_stack_ffffffffffffdb48,0);
          return;
        }
        iVar2 = number_percent();
        if (iVar2 < 0x32) {
          do_say(in_stack_ffffffffffffeed8,in_stack_ffffffffffffeed0);
        }
        else {
          do_say(in_stack_ffffffffffffeed8,in_stack_ffffffffffffeed0);
        }
        __s = local_2428;
        pcVar4 = pers((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffdb5c,in_stack_ffffffffffffdb58),
                      ch_00);
        sprintf(__s,"Help! I\'m being attacked by %s!",pcVar4);
        do_myell(ch_01,(char *)CONCAT44(in_stack_ffffffffffffdb5c,in_stack_ffffffffffffdb58),ch_00);
        multi_hit(in_stack_ffffffffffffdd80,in_stack_ffffffffffffdd78,in_stack_ffffffffffffdd74);
        return;
      }
      send_to_char((char *)in_stack_ffffffffffffdb60,
                   (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffdb5c,in_stack_ffffffffffffdb58));
      return;
    }
  }
  send_to_char((char *)in_stack_ffffffffffffdb60,
               (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffdb5c,in_stack_ffffffffffffdb58));
  return;
}

Assistant:

void do_enlist(CHAR_DATA *ch, char *argument)
{
	CHAR_DATA *victim;
	char arg[MAX_INPUT_LENGTH];
	int level;
	char buf[MAX_STRING_LENGTH];
	AFFECT_DATA af;
	int chance;
	CHAR_DATA *check;

	chance = get_skill(ch, gsn_enlist);

	if (chance <= 10 || ch->level < skill_table[gsn_enlist].skill_level[ch->Class()->GetIndex()])
	{
		send_to_char("You do not have the skills required to enlist mercenary aid.\n\r", ch);
		return;
	}

	one_argument(argument, arg);

	if (is_affected(ch, gsn_enlist))
	{
		send_to_char("You haven't built up the nerve to recruit anyone else yet.\n\r", ch);
		return;
	}

	if (arg[0] == '\0')
	{
		send_to_char("Who do you wish to enlist as a follower?\n\r", ch);
		return;
	}

	victim = get_char_room(ch, arg);

	if (victim == nullptr)
	{
		send_to_char("They aren't here.\n\r", ch);
		return;
	}

	if (victim == ch)
	{
		send_to_char("You can't recruit yourself.\n\r", ch);
		return;
	}

	if (!is_npc(victim))
	{
		send_to_char("Why not just ask them to join you?\n\r", ch);
		return;
	}

	for (check = char_list; check != nullptr; check = check->next)
	{
		if (is_affected(check, gsn_enlist) && check->master == ch)
		{
			send_to_char("You already have a devoted recruit following you.\n\r", ch);
			return;
		}
	}

	level = ch->level;

	if ((is_good(ch) && is_evil(victim)) || (is_evil(ch) && is_good(victim)))
		level = 0;

	if (is_neutral(victim) || is_neutral(ch))
		level -= 4;

	if (is_affected_by(victim, AFF_CHARM))
		level = 0;

	if ((victim->level + 8) > level)
		level = 0;

	if (saves_spell(level, victim, DAM_OTHER) || level == 0)
	{
		if (number_percent() < 50)
			do_say(victim, "I don't follow scum such as you!");
		else
			do_say(victim, "You couldn't recruit a mangy dog to your company!");

		sprintf(buf, "Help! I'm being attacked by %s!", pers(victim, ch));
		do_myell(ch, buf, victim);
		multi_hit(victim, ch, TYPE_UNDEFINED);
		return;
	}

	victim->leader = ch;
	victim->master = ch;

	init_affect(&af);
	af.where = TO_AFFECTS;
	af.aftype = AFT_SKILL;
	af.type = gsn_enlist;
	af.modifier = 0;
	af.level = ch->level;

	SET_BIT(af.bitvector, AFF_CHARM);

	af.duration = ch->level;
	af.location = 0;
	affect_to_char(victim, &af);

	af.duration = 15;
	affect_to_char(ch, &af);

	act("$N salutes you and prepares to follow into combat.", ch, 0, victim, TO_CHAR);
	act("$N salutes $n and falls into line with $s.", ch, 0, victim, TO_NOTVICT);
}